

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O3

uint16_t crc16(uint16_t crc,uint8_t *buf,size_t len)

{
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = (uint)crc;
  if (len != 0) {
    sVar2 = 0;
    do {
      uVar4 = ((uVar3 ^ buf[sVar2]) & 0xffff) >> 1;
      uVar1 = uVar4 ^ 0xffffa001;
      if (((uVar3 ^ buf[sVar2]) & 1) == 0) {
        uVar1 = uVar4;
      }
      uVar4 = (uVar1 & 0xffff) >> 1;
      uVar3 = uVar4 ^ 0xffffa001;
      if ((uVar1 & 1) == 0) {
        uVar3 = uVar4;
      }
      uVar4 = (uVar3 & 0xffff) >> 1;
      uVar1 = uVar4 ^ 0xffffa001;
      if ((uVar3 & 1) == 0) {
        uVar1 = uVar4;
      }
      uVar4 = (uVar1 & 0xffff) >> 1;
      uVar3 = uVar4 ^ 0xffffa001;
      if ((uVar1 & 1) == 0) {
        uVar3 = uVar4;
      }
      uVar4 = (uVar3 & 0xffff) >> 1;
      uVar1 = uVar4 ^ 0xffffa001;
      if ((uVar3 & 1) == 0) {
        uVar1 = uVar4;
      }
      uVar4 = (uVar1 & 0xffff) >> 1;
      uVar3 = uVar4 ^ 0xffffa001;
      if ((uVar1 & 1) == 0) {
        uVar3 = uVar4;
      }
      uVar4 = (uVar3 & 0xffff) >> 1;
      uVar1 = uVar4 ^ 0xffffa001;
      if ((uVar3 & 1) == 0) {
        uVar1 = uVar4;
      }
      uVar4 = (uVar1 & 0xffff) >> 1;
      uVar3 = uVar4 ^ 0xffffa001;
      if ((uVar1 & 1) == 0) {
        uVar3 = uVar4;
      }
      crc = (uint16_t)uVar3;
      sVar2 = sVar2 + 1;
    } while (len != sVar2);
  }
  return crc;
}

Assistant:

uint16_t crc16(uint16_t crc, uint8_t *buf, size_t len) {
    while (len--) {
        crc ^= *buf++;
        crc  = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
        crc  = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
        crc  = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
        crc  = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
        crc  = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
        crc  = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
        crc  = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
        crc  = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    }
    return crc;
}